

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O1

bool __thiscall
sptk::GaussianMixtureModelBasedConversion::Run
          (GaussianMixtureModelBasedConversion *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *source_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *target_vectors)

{
  int iVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pMVar5;
  long lVar6;
  pointer pdVar7;
  bool bVar8;
  uint uVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  vector<double,_std::allocator<double>_> components_of_log_probability;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> d;
  Buffer buffer;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  e;
  
  if (this->is_valid_ == true) {
    pvVar3 = (source_vectors->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (source_vectors->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (target_vectors !=
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0 && pvVar3 != pvVar4) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&buffer,(long)this->target_length_,
                 &this->magic_number_,(allocator_type *)&d);
      uVar9 = (int)((long)pvVar4 - (long)pvVar3 >> 3) * -0x55555555;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&e,(long)(int)uVar9,(value_type *)&buffer,
               (allocator_type *)&components_of_log_probability);
      if (buffer._vptr_Buffer != (_func_int **)0x0) {
        operator_delete(buffer._vptr_Buffer);
      }
      SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&buffer,this->target_length_);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                (&d,(long)(int)uVar9,(value_type *)&buffer,
                 (allocator_type *)&components_of_log_probability);
      SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&buffer);
      std::vector<double,_std::allocator<double>_>::vector
                (&components_of_log_probability,(long)this->num_mixture_,(allocator_type *)&buffer);
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_0011faf0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      buffer._73_8_ = 0;
      if (0 < (int)uVar9) {
        uVar11 = 0;
        do {
          if (this->use_magic_number_ == true) {
            dVar17 = this->magic_number_;
            pdVar10 = (source_vectors->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar11].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((dVar17 != *pdVar10) || (NAN(dVar17) || NAN(*pdVar10))) goto LAB_00107b7f;
          }
          else {
LAB_00107b7f:
            bVar8 = GaussianMixtureModeling::CalculateLogProbability
                              (this->source_length_ + -1,this->num_mixture_,false,uVar11 == 0,
                               (source_vectors->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar11,&this->weights_,
                               &this->source_mean_vectors_,&this->source_covariance_matrices_,
                               &components_of_log_probability,(double *)0x0,&buffer);
            if (!bVar8) {
              GaussianMixtureModeling::Buffer::~Buffer(&buffer);
              if (components_of_log_probability.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(components_of_log_probability.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              bVar8 = false;
              goto LAB_00107d3c;
            }
            pdVar10 = components_of_log_probability.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
            pdVar12 = components_of_log_probability.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar14 = components_of_log_probability.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar10 !=
                components_of_log_probability.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish &&
                components_of_log_probability.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                components_of_log_probability.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                pdVar12 = pdVar10;
                if (*pdVar10 < *pdVar14 || *pdVar10 == *pdVar14) {
                  pdVar12 = pdVar14;
                }
                pdVar10 = pdVar10 + 1;
                pdVar14 = pdVar12;
              } while (pdVar10 !=
                       components_of_log_probability.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            uVar13 = (long)pdVar12 -
                     (long)components_of_log_probability.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
            iVar1 = this->target_length_;
            if (0 < (long)iVar1) {
              uVar2 = this->source_length_;
              pMVar5 = (this->e_slope_).
                       super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pvVar3 = (source_vectors->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar6 = *(long *)&(this->e_bias_).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)(uVar13 >> 3)].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data;
              pdVar7 = e.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = 0;
              do {
                if ((int)uVar2 < 1) {
                  dVar17 = 0.0;
                }
                else {
                  dVar17 = 0.0;
                  uVar16 = 0;
                  do {
                    dVar17 = dVar17 + *(double *)
                                       (*(long *)(*(long *)((long)&(pMVar5->index_).
                                                                                                                                      
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl + ((long)(uVar13 * 0x20000000) >> 0x1a))
                                                 + lVar15 * 8) + uVar16 * 8) *
                                      *(double *)
                                       (*(long *)&pvVar3[uVar11].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + uVar16 * 8);
                    uVar16 = uVar16 + 1;
                  } while (uVar2 != uVar16);
                }
                pdVar7[lVar15] = dVar17 + *(double *)(lVar6 + lVar15 * 8);
                lVar15 = lVar15 + 1;
              } while (lVar15 != iVar1);
            }
            SymmetricMatrix::operator=
                      (d.
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar11,
                       (SymmetricMatrix *)
                       ((long)&((this->d_).
                                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                       ((long)(uVar13 * 0x20000000) >> 0x1a)));
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uVar9 & 0x7fffffff));
      }
      GaussianMixtureModeling::Buffer::~Buffer(&buffer);
      if (components_of_log_probability.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(components_of_log_probability.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar8 = NonrecursiveMaximumLikelihoodParameterGeneration::Run
                        (&this->mlpg_,&e,&d,target_vectors);
LAB_00107d3c:
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&d);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&e);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool GaussianMixtureModelBasedConversion::Run(
    const std::vector<std::vector<double> >& source_vectors,
    std::vector<std::vector<double> >* target_vectors) const {
  // Check inputs.
  if (!is_valid_ || source_vectors.empty() || NULL == target_vectors) {
    return false;
  }

  // Prepare memories.
  const int sequence_length(static_cast<int>(source_vectors.size()));
  std::vector<std::vector<double> > e(
      sequence_length, std::vector<double>(target_length_, magic_number_));
  std::vector<SymmetricMatrix> d(sequence_length,
                                 SymmetricMatrix(target_length_));

  // Compute posterior probabilities of source input.
  {
    std::vector<double> components_of_log_probability(num_mixture_);
    GaussianMixtureModeling::Buffer buffer;
    for (int t(0); t < sequence_length; ++t) {
      if (use_magic_number_ && magic_number_ == source_vectors[t][0]) {
        continue;
      }

      if (!GaussianMixtureModeling::CalculateLogProbability(
              source_length_ - 1, num_mixture_, false, 0 == t,
              source_vectors[t], weights_, source_mean_vectors_,
              source_covariance_matrices_, &components_of_log_probability, NULL,
              &buffer)) {
        return false;
      }

      const int selected_mixture(static_cast<int>(
          std::max_element(components_of_log_probability.begin(),
                           components_of_log_probability.end()) -
          components_of_log_probability.begin()));

      // Set E.
      for (int l(0); l < target_length_; ++l) {
        double tmp(0.0);
        for (int m(0); m < source_length_; ++m) {
          tmp += e_slope_[selected_mixture][l][m] * source_vectors[t][m];
        }
        e[t][l] = e_bias_[selected_mixture][l] + tmp;
      }

      // Set D.
      d[t] = d_[selected_mixture];
    }
  }

  if (!mlpg_.Run(e, d, target_vectors)) {
    return false;
  }

  return true;
}